

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cc
# Opt level: O0

void __thiscall tt::net::Epoll::epoll_mod(Epoll *this,SP_Channel *request,int timeout)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  __uint32_t *p_Var4;
  undefined1 local_4c [8];
  epoll_event event;
  int fd;
  shared_ptr<tt::net::Channel> local_30;
  int local_1c;
  SP_Channel *pSStack_18;
  int timeout_local;
  SP_Channel *request_local;
  Epoll *this_local;
  
  local_1c = timeout;
  pSStack_18 = request;
  request_local = (SP_Channel *)this;
  if (0 < timeout) {
    std::shared_ptr<tt::net::Channel>::shared_ptr(&local_30,request);
    add_timer(this,&local_30,local_1c);
    std::shared_ptr<tt::net::Channel>::~shared_ptr(&local_30);
  }
  peVar3 = std::__shared_ptr_access<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)request);
  event.data.fd = Channel::getFd(peVar3);
  peVar3 = std::__shared_ptr_access<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)request);
  bVar1 = Channel::EqualAndUpdateLastEvents(peVar3);
  if (!bVar1) {
    local_4c._4_4_ = event.data.fd;
    peVar3 = std::__shared_ptr_access<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)request);
    p_Var4 = Channel::getEvents(peVar3);
    local_4c._0_4_ = *p_Var4;
    iVar2 = epoll_ctl(this->m_epollFd,3,event.data.fd,(epoll_event *)local_4c);
    if (iVar2 < 0) {
      perror("epoll_mod error");
      std::__shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>::reset
                (&this->m_fd2chan[event.data.fd].
                  super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>);
    }
  }
  return;
}

Assistant:

void Epoll::epoll_mod(SP_Channel request, int timeout){
	
	if(timeout > 0) add_timer(request,timeout);

	int fd = request->getFd();
	if(!request->EqualAndUpdateLastEvents()){
		struct epoll_event event;

		event.data.fd = fd;
		event.events = request->getEvents();
		if(epoll_ctl(m_epollFd, EPOLL_CTL_MOD, fd, &event) < 0){
			perror("epoll_mod error");

			m_fd2chan[fd].reset();
		}
	
	}
}